

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O2

Aig_ManPack_t * Aig_ManPackStart(Aig_Man_t *pAig)

{
  Aig_ManPack_t *p;
  
  p = Aig_ManPackAlloc(pAig);
  Aig_ManPackSetRandom(p);
  Aig_ManPackSimulate(p);
  Aig_ManPackPrintStats(p);
  return p;
}

Assistant:

Aig_ManPack_t * Aig_ManPackStart( Aig_Man_t * pAig )
{
    Aig_ManPack_t * p;
    p = Aig_ManPackAlloc( pAig );
    Aig_ManPackSetRandom( p );
    Aig_ManPackSimulate( p );
    Aig_ManPackPrintStats( p );
    return p;
}